

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3unas.cpp
# Opt level: O0

void CTcT3Unasm::disasm_instr(CTcUnasSrc *src,CTcUnasOut *out,char ch_op)

{
  char *pcVar1;
  long *plVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  unsigned_long uVar7;
  long lVar8;
  byte in_DL;
  char *pcVar9;
  long *in_RSI;
  long *in_RDI;
  uint j;
  char name [128];
  uint len;
  char *val;
  char valbuf [128];
  char *dt;
  ulong prv_ofs;
  char ch [10];
  ulong acc;
  int i;
  t3_instr_info_t *info;
  uint local_16c;
  undefined1 local_168 [132];
  uint local_e4;
  char *local_e0;
  char local_d8 [136];
  char *local_50;
  long local_48;
  byte local_3a;
  undefined1 uStack_39;
  undefined1 uStack_38;
  undefined1 uStack_37;
  undefined1 uStack_36;
  undefined1 uStack_35;
  undefined1 auStack_34 [4];
  ulong local_30;
  int local_24;
  t3_instr_info_t *local_20;
  byte local_11;
  long *local_10;
  long *local_8;
  
  local_11 = in_DL;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_48 = (**(code **)(*in_RDI + 0x18))();
  plVar2 = local_10;
  local_20 = instr_info + local_11;
  lVar6 = (**(code **)(*local_8 + 0x18))();
  (**(code **)(*plVar2 + 0x10))(plVar2,"%8lx  %-14.14s ",lVar6 + -1,local_20->nm);
  if (local_11 == 0x57) {
    (**(code **)(*local_8 + 0x10))(local_8,&local_3a);
    (**(code **)(*local_8 + 0x10))(local_8,&uStack_39);
    (**(code **)(*local_8 + 0x10))(local_8,&uStack_38);
    iVar3 = ::osrp2(&local_3a);
    local_30 = (ulong)iVar3;
    (**(code **)(*local_10 + 0x10))(local_10,"len=0x%x, cnt=0x%x [",iVar3,local_3a);
    local_30 = (ulong)local_3a;
    for (local_24 = 0; local_24 < (int)local_30; local_24 = local_24 + 1) {
      (**(code **)(*local_8 + 0x10))(local_8,&local_3a);
      (**(code **)(*local_8 + 0x10))(local_8,&local_3a);
      local_e4 = ::osrp2(&local_3a);
      for (local_16c = 0; local_16c < local_e4 && local_16c < 0x80; local_16c = local_16c + 1) {
        (**(code **)(*local_8 + 0x10))(local_8,local_168 + local_16c);
      }
      pcVar9 = ":";
      if (0 < local_24) {
        pcVar9 = ", ";
      }
      (**(code **)(*local_10 + 0x10))(local_10,"%s%.*s",pcVar9,local_16c,local_168);
      for (; local_16c < local_e4; local_16c = local_16c + 1) {
        (**(code **)(*local_8 + 0x10))(local_8,&local_3a);
      }
    }
    (**(code **)(*local_10 + 0x10))(local_10,"]");
  }
  else if (local_11 == 0x90) {
    (**(code **)(*local_8 + 0x10))(local_8,&local_3a);
    (**(code **)(*local_8 + 0x10))(local_8,&uStack_39);
    iVar3 = ::osrp2(&local_3a);
    local_30 = (ulong)iVar3;
    (**(code **)(*local_10 + 0x10))(local_10,"0x%x\n",iVar3);
    for (local_24 = 0; local_24 < (int)local_30; local_24 = local_24 + 1) {
      local_e0 = local_d8;
      local_48 = (**(code **)(*local_8 + 0x18))();
      (**(code **)(*local_8 + 0x10))(local_8,&local_3a);
      (**(code **)(*local_8 + 0x10))(local_8,&uStack_39);
      (**(code **)(*local_8 + 0x10))(local_8,&uStack_38);
      (**(code **)(*local_8 + 0x10))(local_8,&uStack_37);
      (**(code **)(*local_8 + 0x10))(local_8,&uStack_36);
      (**(code **)(*local_8 + 0x10))(local_8,&uStack_35);
      (**(code **)(*local_8 + 0x10))(local_8,auStack_34);
      lVar6 = (**(code **)(*local_8 + 0x18))();
      if (lVar6 == local_48) break;
      switch(local_3a) {
      case 1:
        local_50 = "nil";
        local_e0 = "";
        break;
      case 2:
        local_50 = "true";
        local_e0 = "";
        break;
      default:
        local_50 = "???";
        local_e0 = "???";
        break;
      case 5:
        local_50 = "object";
        uVar7 = ::osrp4(&uStack_39);
        sprintf(local_d8,"0x%08lx",uVar7 & 0xffffffff);
        break;
      case 6:
        local_50 = "prop";
        uVar4 = ::osrp2(&uStack_39);
        sprintf(local_d8,"0x%04x",(ulong)uVar4);
        break;
      case 7:
        local_50 = "int";
        uVar7 = ::osrp4(&uStack_39);
        sprintf(local_d8,"0x%08lx",uVar7 & 0xffffffff);
        break;
      case 8:
        local_50 = "sstring";
        uVar7 = ::osrp4(&uStack_39);
        sprintf(local_d8,"0x%08lx",uVar7 & 0xffffffff);
        break;
      case 10:
        local_50 = "list";
        uVar7 = ::osrp4(&uStack_39);
        sprintf(local_d8,"0x%08lx",uVar7 & 0xffffffff);
        break;
      case 0xc:
        local_50 = "funcptr";
        uVar7 = ::osrp4(&uStack_39);
        sprintf(local_d8,"0x%08lx",uVar7 & 0xffffffff);
        break;
      case 0xf:
        local_50 = "enum";
        uVar7 = ::osrp4(&uStack_39);
        sprintf(local_d8,"0x%08lx",uVar7 & 0xffffffff);
      }
      plVar2 = local_10;
      lVar6 = (**(code **)(*local_8 + 0x18))();
      pcVar1 = local_50;
      pcVar9 = local_e0;
      iVar3 = ::osrp2(&uStack_35);
      lVar8 = (**(code **)(*local_8 + 0x18))();
      iVar5 = ::osrp2s(&uStack_35);
      (**(code **)(*plVar2 + 0x10))
                (plVar2,"          0x%08lx      %-8.8s(%-10.10s) -> +0x%04lx (0x%08lx)\n",lVar6 + -7
                 ,pcVar1,pcVar9,iVar3,lVar8 + -2 + (long)iVar5);
    }
    (**(code **)(*local_8 + 0x10))(local_8,&local_3a);
    (**(code **)(*local_8 + 0x10))(local_8,&uStack_39);
    lVar6 = (**(code **)(*local_8 + 0x18))();
    iVar3 = ::osrp2(&local_3a);
    lVar8 = (**(code **)(*local_8 + 0x18))();
    iVar5 = ::osrp2s(&local_3a);
    (**(code **)(*local_10 + 0x10))
              (local_10,"          0x%08lx      default              -> +0x%04lx (0x%08lx)\n",
               lVar6 + -2,iVar3,lVar8 + -2 + (long)iVar5);
  }
  else {
    for (local_24 = 0; local_24 < local_20->op_cnt; local_24 = local_24 + 1) {
      if (local_24 != 0) {
        (**(code **)(*local_10 + 0x10))(local_10,", ");
      }
      switch(local_20->op_type[local_24]) {
      case T3OP_TYPE_8S:
        (**(code **)(*local_8 + 0x10))(local_8,&local_3a);
        (**(code **)(*local_10 + 0x10))(local_10,"0x%x",(int)(char)local_3a);
        break;
      case T3OP_TYPE_8U:
        (**(code **)(*local_8 + 0x10))(local_8,&local_3a);
        (**(code **)(*local_10 + 0x10))(local_10,"0x%x",local_3a);
        break;
      case T3OP_TYPE_16S:
        (**(code **)(*local_8 + 0x10))(local_8,&local_3a);
        (**(code **)(*local_8 + 0x10))(local_8,&uStack_39);
        iVar3 = ::osrp2s(&local_3a);
        local_30 = (ulong)iVar3;
        (**(code **)(*local_10 + 0x10))(local_10,"0x%x",iVar3);
        break;
      case T3OP_TYPE_16U:
        (**(code **)(*local_8 + 0x10))(local_8,&local_3a);
        (**(code **)(*local_8 + 0x10))(local_8,&uStack_39);
        iVar3 = ::osrp2(&local_3a);
        local_30 = (ulong)iVar3;
        (**(code **)(*local_10 + 0x10))(local_10,"0x%x",iVar3);
        break;
      case T3OP_TYPE_32S:
        (**(code **)(*local_8 + 0x10))(local_8,&local_3a);
        (**(code **)(*local_8 + 0x10))(local_8,&uStack_39);
        (**(code **)(*local_8 + 0x10))(local_8,&uStack_38);
        (**(code **)(*local_8 + 0x10))(local_8,&uStack_37);
        uVar7 = ::osrp4(&local_3a);
        local_30 = uVar7 & 0xffffffff;
        (**(code **)(*local_10 + 0x10))(local_10,"0x%lx",local_30);
        break;
      case T3OP_TYPE_32U:
        (**(code **)(*local_8 + 0x10))(local_8,&local_3a);
        (**(code **)(*local_8 + 0x10))(local_8,&uStack_39);
        (**(code **)(*local_8 + 0x10))(local_8,&uStack_38);
        (**(code **)(*local_8 + 0x10))(local_8,&uStack_37);
        uVar7 = ::osrp4(&local_3a);
        local_30 = uVar7 & 0xffffffff;
        (**(code **)(*local_10 + 0x10))(local_10,"0x%lx",local_30);
        break;
      case T3OP_TYPE_STR:
        (**(code **)(*local_8 + 0x10))(local_8,&local_3a);
        (**(code **)(*local_8 + 0x10))(local_8,&uStack_39);
        (**(code **)(*local_8 + 0x10))(local_8,&uStack_38);
        (**(code **)(*local_8 + 0x10))(local_8,&uStack_37);
        uVar7 = ::osrp4(&local_3a);
        local_30 = uVar7 & 0xffffffff;
        (**(code **)(*local_10 + 0x10))(local_10,"string(0x%lx)",local_30);
        break;
      case T3OP_TYPE_LIST:
        (**(code **)(*local_8 + 0x10))(local_8,&local_3a);
        (**(code **)(*local_8 + 0x10))(local_8,&uStack_39);
        (**(code **)(*local_8 + 0x10))(local_8,&uStack_38);
        (**(code **)(*local_8 + 0x10))(local_8,&uStack_37);
        uVar7 = ::osrp4(&local_3a);
        local_30 = uVar7 & 0xffffffff;
        (**(code **)(*local_10 + 0x10))(local_10,"list(0x%lx)",local_30);
        break;
      case T3OP_TYPE_CODE_ABS:
        (**(code **)(*local_8 + 0x10))(local_8,&local_3a);
        (**(code **)(*local_8 + 0x10))(local_8,&uStack_39);
        (**(code **)(*local_8 + 0x10))(local_8,&uStack_38);
        (**(code **)(*local_8 + 0x10))(local_8,&uStack_37);
        uVar7 = ::osrp4(&local_3a);
        local_30 = uVar7 & 0xffffffff;
        (**(code **)(*local_10 + 0x10))(local_10,"code(0x%08lx)",local_30);
        break;
      case T3OP_TYPE_CODE_REL:
        (**(code **)(*local_8 + 0x10))(local_8,&local_3a);
        (**(code **)(*local_8 + 0x10))(local_8,&uStack_39);
        iVar3 = ::osrp2s(&local_3a);
        plVar2 = local_10;
        local_30 = (ulong)iVar3;
        if ((long)local_30 < 0) {
          lVar6 = (**(code **)(*local_8 + 0x18))();
          (**(code **)(*plVar2 + 0x10))(plVar2,"-0x%04x (0x%08lx)",-iVar3,lVar6 + -2 + local_30);
        }
        else {
          lVar6 = (**(code **)(*local_8 + 0x18))();
          (**(code **)(*plVar2 + 0x10))(plVar2,"+0x%04x (0x%08lx)",iVar3,lVar6 + -2 + local_30);
        }
        break;
      case T3OP_TYPE_OBJ:
        (**(code **)(*local_8 + 0x10))(local_8,&local_3a);
        (**(code **)(*local_8 + 0x10))(local_8,&uStack_39);
        (**(code **)(*local_8 + 0x10))(local_8,&uStack_38);
        (**(code **)(*local_8 + 0x10))(local_8,&uStack_37);
        uVar7 = ::osrp4(&local_3a);
        local_30 = uVar7 & 0xffffffff;
        (**(code **)(*local_10 + 0x10))(local_10,"object(0x%lx)",local_30);
        break;
      case T3OP_TYPE_PROP:
        (**(code **)(*local_8 + 0x10))(local_8,&local_3a);
        (**(code **)(*local_8 + 0x10))(local_8,&uStack_39);
        iVar3 = ::osrp2(&local_3a);
        local_30 = (ulong)iVar3;
        (**(code **)(*local_10 + 0x10))(local_10,"property(0x%x)",iVar3);
        break;
      case T3OP_TYPE_ENUM:
        (**(code **)(*local_8 + 0x10))(local_8,&local_3a);
        (**(code **)(*local_8 + 0x10))(local_8,&uStack_39);
        (**(code **)(*local_8 + 0x10))(local_8,&uStack_38);
        (**(code **)(*local_8 + 0x10))(local_8,&uStack_37);
        uVar7 = ::osrp4(&local_3a);
        local_30 = uVar7 & 0xffffffff;
        (**(code **)(*local_10 + 0x10))(local_10,"enum(0x%lx)",local_30);
        break;
      case T3OP_TYPE_CTX_ELE:
        (**(code **)(*local_8 + 0x10))(local_8,&local_3a);
        if (local_3a == 1) {
          (**(code **)(*local_10 + 0x10))(local_10,"targetprop");
        }
        else if (local_3a == 2) {
          (**(code **)(*local_10 + 0x10))(local_10,"targetobj");
        }
        else if (local_3a == 3) {
          (**(code **)(*local_10 + 0x10))(local_10,"definingobj");
        }
        else {
          (**(code **)(*local_10 + 0x10))(local_10,"0x%x",(int)(char)local_3a);
        }
        break;
      case T3OP_TYPE_INLINE_STR:
        (**(code **)(*local_8 + 0x10))(local_8,&local_3a);
        (**(code **)(*local_8 + 0x10))(local_8,&uStack_39);
        (**(code **)(*local_10 + 0x10))(local_10,"string(inline)");
        iVar3 = ::osrp2(&local_3a);
        for (local_30 = (ulong)iVar3; local_30 != 0; local_30 = local_30 - 1) {
          (**(code **)(*local_8 + 0x10))(local_8,&local_3a);
        }
        break;
      default:
        (**(code **)(*local_10 + 0x10))(local_10,"...unknown type...");
      }
    }
    (**(code **)(*local_10 + 0x10))(local_10,"\n");
  }
  return;
}

Assistant:

void CTcT3Unasm::disasm_instr(CTcUnasSrc *src, CTcUnasOut *out, char ch_op)
{
    t3_instr_info_t *info;
    int i;
    ulong acc;
    char ch[10];
    ulong prv_ofs = src->get_ofs();
    
    /* get the information on this instruction */
    info = &instr_info[(int)(uchar)ch_op];
    out->print("%8lx  %-14.14s ", src->get_ofs() - 1, info->nm);

    /* check the instruction type */
    switch((uchar)ch_op)
    {
    case OPC_SWITCH:
        /* 
         *   It's a switch instruction - special handling is required,
         *   since this instruction doesn't fit any of the normal
         *   patterns.  First, get the number of elements in the case
         *   table - this is a UINT2 value at the start of the table.  
         */
        src->next_byte(ch);
        src->next_byte(ch+1);
        acc = osrp2(ch);

        /* display the count */
        out->print("0x%x\n", (uint)acc);

        /* display the table */
        for (i = 0 ; i < (int)acc ; ++i)
        {
            const char *dt;
            char valbuf[128];
            const char *val = valbuf;

            /* note the current offset */
            prv_ofs = src->get_ofs();
            
            /* read the DATAHOLDER value */
            src->next_byte(ch);
            src->next_byte(ch+1);
            src->next_byte(ch+2);
            src->next_byte(ch+3);
            src->next_byte(ch+4);

            /* read the jump offset */
            src->next_byte(ch+5);
            src->next_byte(ch+6);

            /* 
             *   stop looping if the offset hasn't changed - this probably
             *   means we're stuck trying to interpret as a "switch" some
             *   data at the end of the stream that happens to look like a
             *   switch but really isn't (such as an exception table, or
             *   debug records) 
             */
            if (src->get_ofs() == prv_ofs)
                break;

            /* show the value */
            switch(ch[0])
            {
            case VM_NIL:
                dt = "nil";
                val = "";
                break;
                
            case VM_TRUE:
                dt = "true";
                val = "";
                break;
                
            case VM_OBJ:
                dt = "object";
                sprintf(valbuf, "0x%08lx", t3rp4u(ch+1));
                break;
                
            case VM_PROP:
                dt = "prop";
                sprintf(valbuf, "0x%04x", osrp2(ch+1));
                break;
                
            case VM_INT:
                dt = "int";
                sprintf(valbuf, "0x%08lx", t3rp4u(ch+1));
                break;

            case VM_ENUM:
                dt = "enum";
                sprintf(valbuf, "0x%08lx", t3rp4u(ch+1));
                break;
                
            case VM_SSTRING:
                dt = "sstring";
                sprintf(valbuf, "0x%08lx", t3rp4u(ch+1));
                break;
                
            case VM_LIST:
                dt = "list";
                sprintf(valbuf, "0x%08lx", t3rp4u(ch+1));
                break;
                
            case VM_FUNCPTR:
                dt = "funcptr";
                sprintf(valbuf, "0x%08lx", t3rp4u(ch+1));
                break;

            default:
                dt = "???";
                val = "???";
                break;
            }

            /* show the slot data */
            out->print("          0x%08lx      %-8.8s(%-10.10s) "
                       "-> +0x%04lx (0x%08lx)\n",
                       src->get_ofs() - 7, dt, val, osrp2(ch+5),
                       src->get_ofs() - 2 + osrp2s(ch+5));
        }

        /* read and show the 'default' jump offset */
        src->next_byte(ch);
        src->next_byte(ch+1);
        out->print("          0x%08lx      default              "
                   "-> +0x%04lx (0x%08lx)\n",
                   src->get_ofs() - 2, osrp2(ch),
                   src->get_ofs() - 2 + osrp2s(ch));

        /* done */
        break;

    case OPC_NAMEDARGTAB:
        /* named argument table */
        src->next_byte(ch);
        src->next_byte(ch+1);
        src->next_byte(ch+2);
        acc = osrp2(ch);
        out->print("len=0x%x, cnt=0x%x [", (uint)acc, (uint)(uchar)*ch);
        acc = (uchar)*ch;

        /* show the names */
        for (i = 0 ; i < (int)acc ; ++i)
        {
            /* get the length */
            src->next_byte(ch);
            src->next_byte(ch);
            uint len = osrp2(ch);

            /* get the name */
            char name[128];
            uint j;
            for (j = 0 ; j < len && j < sizeof(name) ; ++j)
                src->next_byte(name + j);

            /* show the name */
            out->print("%s%.*s", i > 0 ? ", " : ":", (int)j, name);

            /* skip any excess portion of the name */
            for ( ; j < len ; ++j)
                src->next_byte(ch);
        }

        /* end the list, and we're done */
        out->print("]");
        break;

    default:
        /* show all parameters */
        for (i = 0 ; i < info->op_cnt ; ++i)
        {
            /* add a separator if this isn't the first one */
            if (i != 0)
                out->print(", ");
            
            /* display the operand */
            switch(info->op_type[i])
            {
            case T3OP_TYPE_8S:
                /* 8-bit signed integer */
                src->next_byte(ch);
                out->print("0x%x", (int)ch[0]);
                break;

            case T3OP_TYPE_8U:
                /* 8-bit unsigned integer */
                src->next_byte(ch);
                out->print("0x%x", (uint)(uchar)ch[0]);
                break;

            case T3OP_TYPE_16S:
                /* 16-bit signed integer */
                src->next_byte(ch);
                src->next_byte(ch+1);
                acc = osrp2s(ch);
                out->print("0x%x", (int)acc);
                break;

            case T3OP_TYPE_16U:
                /* 16-bit unsigned integer */
                src->next_byte(ch);
                src->next_byte(ch+1);
                acc = osrp2(ch);
                out->print("0x%x", (uint)acc);
                break;

            case T3OP_TYPE_32S:
                /* 32-bit signed integer */
                src->next_byte(ch);
                src->next_byte(ch+1);
                src->next_byte(ch+2);
                src->next_byte(ch+3);
                acc = t3rp4u(ch);
                out->print("0x%lx", acc);
                break;

            case T3OP_TYPE_32U:
                /* 32-bit unsigned integer */
                src->next_byte(ch);
                src->next_byte(ch+1);
                src->next_byte(ch+2);
                src->next_byte(ch+3);
                acc = t3rp4u(ch);
                out->print("0x%lx", acc);
                break;

            case T3OP_TYPE_STR:
                /* string offset */
                src->next_byte(ch);
                src->next_byte(ch+1);
                src->next_byte(ch+2);
                src->next_byte(ch+3);
                acc = t3rp4u(ch);
                out->print("string(0x%lx)", acc);
                break;

            case T3OP_TYPE_LIST:
                /* list offset */
                src->next_byte(ch);
                src->next_byte(ch+1);
                src->next_byte(ch+2);
                src->next_byte(ch+3);
                acc = t3rp4u(ch);
                out->print("list(0x%lx)", acc);
                break;

            case T3OP_TYPE_CODE_ABS:
                /* 32-bit absolute code address */
                src->next_byte(ch);
                src->next_byte(ch+1);
                src->next_byte(ch+2);
                src->next_byte(ch+3);
                acc = t3rp4u(ch);
                out->print("code(0x%08lx)", acc);
                break;

            case T3OP_TYPE_CODE_REL:
                /* 16-bit relative code address */
                src->next_byte(ch);
                src->next_byte(ch+1);
                acc = osrp2s(ch);
                if ((long)acc < 0)
                    out->print("-0x%04x (0x%08lx)",
                               -(int)acc, src->get_ofs() - 2 + acc);
                else
                    out->print("+0x%04x (0x%08lx)",
                               (int)acc, src->get_ofs() - 2 + acc);
                break;

            case T3OP_TYPE_OBJ:
                /* object ID */
                src->next_byte(ch);
                src->next_byte(ch+1);
                src->next_byte(ch+2);
                src->next_byte(ch+3);
                acc = t3rp4u(ch);
                out->print("object(0x%lx)", acc);
                break;

            case T3OP_TYPE_PROP:
                /* property ID */
                src->next_byte(ch);
                src->next_byte(ch+1);
                acc = osrp2(ch);
                out->print("property(0x%x)", (uint)acc);
                break;

            case T3OP_TYPE_ENUM:
                /* enum */
                src->next_byte(ch);
                src->next_byte(ch+1);
                src->next_byte(ch+2);
                src->next_byte(ch+3);
                acc = t3rp4u(ch);
                out->print("enum(0x%lx)", acc);
                break;

            case T3OP_TYPE_CTX_ELE:
                /* context element identifier */
                src->next_byte(ch);
                switch(ch[0])
                {
                case PUSHCTXELE_TARGPROP:
                    out->print("targetprop");
                    break;

                case PUSHCTXELE_TARGOBJ:
                    out->print("targetobj");
                    break;

                case PUSHCTXELE_DEFOBJ:
                    out->print("definingobj");
                    break;

                default:
                    out->print("0x%x", (int)ch[0]);
                    break;
                }
                break;

            case T3OP_TYPE_INLINE_STR:
                /* get the string length */
                src->next_byte(ch);
                src->next_byte(ch+1);

                /* show it */
                out->print("string(inline)");

                /* skip the string */
                for (acc = osrp2(ch) ; acc != 0 ; --acc)
                    src->next_byte(ch);

                /* done */
                break;

            default:
                out->print("...unknown type...");
                break;
            }
        }

        /* end the line */
        out->print("\n");
    }
}